

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# armformatter.cpp
# Opt level: O0

Error asmjit::v1_14::arm::FormatterInternal::formatOperand
                (String *sb,FormatFlags flags,BaseEmitter *emitter,Arch arch,Operand_ *op)

{
  bool bVar1;
  Error EVar2;
  uint uVar3;
  FormatFlags in_ESI;
  String *in_RDI;
  uint *in_R8;
  BaseRegList *regList;
  Error _err_19;
  Error _err_18;
  Error _err_17;
  uint32_t predicate;
  int64_t val;
  Imm *i;
  Error _err_16;
  Error _err_15;
  Error _err_14;
  Error _err_13;
  Error _err_12;
  Error _err_11;
  Error _err_10;
  Error _err_9;
  uint32_t base;
  int64_t off;
  Error _err_8;
  Error _err_7;
  Error _err_6;
  Error _err_5;
  Error _err_4;
  Error _err_3;
  Error _err_2;
  FormatFlags modifiedFlags;
  Error _err_1;
  Error _err;
  Mem *m;
  uint32_t elementIndex;
  uint32_t elementType;
  BaseReg *reg;
  undefined4 in_stack_fffffffffffff9b0;
  char c;
  ModifyOp in_stack_fffffffffffff9b4;
  String *in_stack_fffffffffffff9b8;
  size_t in_stack_fffffffffffff9c0;
  uint *size;
  char *in_stack_fffffffffffff9c8;
  ModifyOp in_stack_fffffffffffff9d4;
  Error in_stack_fffffffffffff9d8;
  undefined4 in_stack_fffffffffffff9dc;
  undefined8 in_stack_fffffffffffff9e0;
  ulong uVar4;
  BaseEmitter *in_stack_fffffffffffff9e8;
  FormatFlags in_stack_fffffffffffff9f4;
  undefined4 in_stack_fffffffffffff9f8;
  undefined4 in_stack_fffffffffffff9fc;
  int local_5ec;
  undefined8 in_stack_fffffffffffffa18;
  String *pSVar5;
  undefined4 in_stack_fffffffffffffa20;
  uint32_t in_stack_fffffffffffffa24;
  undefined4 in_stack_fffffffffffffa28;
  FormatFlags in_stack_fffffffffffffa2c;
  undefined4 in_stack_fffffffffffffa30;
  FormatFlags in_stack_fffffffffffffa34;
  undefined4 in_stack_fffffffffffffa38;
  undefined4 in_stack_fffffffffffffa3c;
  Error local_574;
  undefined8 in_stack_fffffffffffffa90;
  StringFormatFlags flags_00;
  size_t in_stack_fffffffffffffa98;
  undefined8 in_stack_fffffffffffffaa0;
  uint32_t base_00;
  uint64_t in_stack_fffffffffffffaa8;
  uint64_t i_00;
  undefined8 in_stack_fffffffffffffab0;
  ModifyOp MVar6;
  String *in_stack_fffffffffffffab8;
  uint32_t in_stack_fffffffffffffbe0;
  uint32_t in_stack_fffffffffffffbe8;
  uint local_3a4 [3];
  undefined4 local_398;
  uint local_394 [10];
  undefined4 local_36c;
  undefined1 *local_368;
  undefined4 local_35c;
  uint local_34c [4];
  uint local_33c [18];
  undefined4 local_2f4;
  undefined8 local_2f0;
  undefined4 local_2e4;
  ulong local_2e0;
  undefined4 local_2cc;
  undefined8 local_2c8;
  int local_2bc;
  String *local_2b8;
  undefined4 local_18c;
  uint local_180;
  undefined4 local_17c;
  uint local_170;
  undefined4 local_16c;
  uint local_160;
  undefined4 local_15c;
  uint *local_158;
  undefined4 local_14c;
  uint *local_148;
  undefined4 local_13c;
  uint *local_138;
  undefined4 local_12c;
  uint local_11c;
  undefined4 *local_118;
  uint *local_110;
  undefined1 local_105;
  undefined4 local_104;
  undefined1 local_e2;
  undefined1 local_e1;
  undefined4 local_30;
  undefined4 local_2c;
  undefined4 local_28;
  undefined4 local_24;
  
  MVar6 = (ModifyOp)((ulong)in_stack_fffffffffffffab0 >> 0x20);
  base_00 = (uint32_t)((ulong)in_stack_fffffffffffffaa0 >> 0x20);
  flags_00 = (StringFormatFlags)((ulong)in_stack_fffffffffffffa90 >> 0x20);
  c = (char)((uint)in_stack_fffffffffffff9b0 >> 0x18);
  if ((*in_R8 & 7) == 1) {
    local_574 = formatRegister((String *)
                               CONCAT44(in_stack_fffffffffffffa34,in_stack_fffffffffffffa30),
                               in_stack_fffffffffffffa2c,
                               (BaseEmitter *)
                               CONCAT44(in_stack_fffffffffffffa24,in_stack_fffffffffffffa20),
                               (Arch)((ulong)in_stack_fffffffffffffa18 >> 0x38),
                               (RegType)((ulong)in_stack_fffffffffffffa18 >> 0x30),
                               (uint32_t)in_stack_fffffffffffffa18,in_stack_fffffffffffffbe0,
                               in_stack_fffffffffffffbe8);
  }
  else if ((*in_R8 & 7) == 2) {
    local_574 = String::_opChar(in_stack_fffffffffffff9b8,in_stack_fffffffffffff9b4,c);
    if (local_574 == 0) {
      local_16c = 0xf8;
      local_3a4[0] = *in_R8 & 0xf8;
      local_138 = local_3a4;
      local_13c = 0;
      local_160 = local_3a4[0];
      if (local_3a4[0] == 0) {
        local_18c = 0x1f00;
        local_33c[0] = *in_R8 & 0x1f00;
        local_158 = local_33c;
        local_15c = 0;
        local_180 = local_33c[0];
        if ((local_33c[0] != 0) ||
           (local_e2 = (*in_R8 >> 3 & 0x1f) == 0,
           in_R8[3] != 0 || (in_R8[1] & -(uint)(byte)local_e2) != 0)) {
          EVar2 = String::_opString((String *)
                                    CONCAT44(in_stack_fffffffffffff9dc,in_stack_fffffffffffff9d8),
                                    in_stack_fffffffffffff9d4,in_stack_fffffffffffff9c8,
                                    in_stack_fffffffffffff9c0);
          if (EVar2 != 0) {
            return EVar2;
          }
          in_stack_fffffffffffffa30 = 0;
        }
      }
      else {
        local_12c = 0xf8;
        local_394[0] = *in_R8 & 0xf8;
        local_105 = 1;
        local_398 = 8;
        local_110 = local_394;
        local_118 = &local_398;
        local_11c = local_394[0];
        local_104 = local_398;
        if (local_394[0] == 8) {
          EVar2 = Formatter::formatLabel
                            ((String *)CONCAT44(in_stack_fffffffffffffa3c,in_stack_fffffffffffffa38)
                             ,in_stack_fffffffffffffa34,
                             (BaseEmitter *)
                             CONCAT44(in_stack_fffffffffffffa2c,in_stack_fffffffffffffa28),
                             in_stack_fffffffffffffa24);
          if (EVar2 != 0) {
            return EVar2;
          }
        }
        else {
          if ((*in_R8 & 0x2000) != 0) {
            EVar2 = String::_opChar(in_stack_fffffffffffff9b8,in_stack_fffffffffffff9b4,c);
            if (EVar2 != 0) {
              return EVar2;
            }
            local_35c = 0x10;
            local_36c = 0xffffffef;
            local_368 = &stack0xfffffffffffffa3c;
          }
          c = -1;
          EVar2 = formatRegister((String *)
                                 CONCAT44(in_stack_fffffffffffffa34,in_stack_fffffffffffffa30),
                                 in_stack_fffffffffffffa2c,
                                 (BaseEmitter *)
                                 CONCAT44(in_stack_fffffffffffffa24,in_stack_fffffffffffffa20),
                                 (Arch)((ulong)in_stack_fffffffffffffa18 >> 0x38),
                                 (RegType)((ulong)in_stack_fffffffffffffa18 >> 0x30),
                                 (uint32_t)in_stack_fffffffffffffa18,in_stack_fffffffffffffbe0,
                                 in_stack_fffffffffffffbe8);
          if (EVar2 != 0) {
            return EVar2;
          }
          in_stack_fffffffffffffa34 = kNone;
        }
      }
      if ((*in_R8 >> 0x18 & 3) == 2) {
        EVar2 = String::_opChar(in_stack_fffffffffffff9b8,in_stack_fffffffffffff9b4,c);
        if (EVar2 != 0) {
          return EVar2;
        }
        in_stack_fffffffffffffa2c = kNone;
      }
      local_17c = 0x1f00;
      local_34c[0] = *in_R8 & 0x1f00;
      local_148 = local_34c;
      local_14c = 0;
      local_170 = local_34c[0];
      if (local_34c[0] != 0) {
        EVar2 = String::_opString((String *)
                                  CONCAT44(in_stack_fffffffffffff9dc,in_stack_fffffffffffff9d8),
                                  in_stack_fffffffffffff9d4,in_stack_fffffffffffff9c8,
                                  in_stack_fffffffffffff9c0);
        if (EVar2 != 0) {
          return EVar2;
        }
        c = -1;
        EVar2 = formatRegister((String *)
                               CONCAT44(in_stack_fffffffffffffa34,in_stack_fffffffffffffa30),
                               in_stack_fffffffffffffa2c,
                               (BaseEmitter *)
                               CONCAT44(in_stack_fffffffffffffa24,in_stack_fffffffffffffa20),
                               (Arch)((ulong)in_stack_fffffffffffffa18 >> 0x38),
                               (RegType)((ulong)in_stack_fffffffffffffa18 >> 0x30),
                               (uint32_t)in_stack_fffffffffffffa18,in_stack_fffffffffffffbe0,
                               in_stack_fffffffffffffbe8);
        if (EVar2 != 0) {
          return EVar2;
        }
      }
      local_e1 = (*in_R8 >> 3 & 0x1f) == 0;
      if (in_R8[3] != 0 || (in_R8[1] & -(uint)(byte)local_e1) != 0) {
        EVar2 = String::_opString((String *)
                                  CONCAT44(in_stack_fffffffffffff9dc,in_stack_fffffffffffff9d8),
                                  in_stack_fffffffffffff9d4,in_stack_fffffffffffff9c8,
                                  in_stack_fffffffffffff9c0);
        if (EVar2 != 0) {
          return EVar2;
        }
        if ((*in_R8 >> 3 & 0x1f) == 0) {
          in_stack_fffffffffffff9b8 = (String *)CONCAT44(in_R8[1],in_R8[3]);
        }
        else {
          in_stack_fffffffffffff9b8 = (String *)(long)(int)in_R8[3];
        }
        local_5ec = 10;
        size = in_R8;
        pSVar5 = in_stack_fffffffffffff9b8;
        bVar1 = Support::test<asmjit::v1_14::FormatFlags,asmjit::v1_14::FormatFlags>
                          (in_ESI,kHexOffsets);
        if ((bVar1) && ((String *)0x9 < pSVar5)) {
          local_5ec = 0x10;
        }
        if (local_5ec == 10) {
          local_2bc = local_5ec;
          local_2c8 = 0;
          local_2cc = 0;
          local_2c = 0;
          local_30 = 0x80000000;
          local_2b8 = pSVar5;
          EVar2 = String::_opNumber(in_stack_fffffffffffffab8,MVar6,in_stack_fffffffffffffaa8,
                                    base_00,in_stack_fffffffffffffa98,flags_00);
        }
        else {
          EVar2 = String::_opString((String *)
                                    CONCAT44(in_stack_fffffffffffff9dc,in_stack_fffffffffffff9d8),
                                    in_stack_fffffffffffff9d4,in_stack_fffffffffffff9c8,(size_t)size
                                   );
          if (EVar2 != 0) {
            return EVar2;
          }
          EVar2 = String::_opNumber(in_stack_fffffffffffffab8,MVar6,in_stack_fffffffffffffaa8,
                                    base_00,in_stack_fffffffffffffa98,flags_00);
        }
        if (EVar2 != 0) {
          return EVar2;
        }
      }
      if (((((*in_R8 & 0x7c000) == 0) ||
           ((local_574 = String::_opChar(in_stack_fffffffffffff9b8,in_stack_fffffffffffff9b4,c),
            local_574 == 0 &&
            ((((*in_R8 >> 0x18 & 3) != 0 ||
              (local_574 = formatShiftOp(in_stack_fffffffffffff9b8,in_stack_fffffffffffff9b4),
              local_574 == 0)) &&
             (local_574 = String::_opFormat(in_RDI,kAppend," %u",(ulong)(*in_R8 >> 0xe & 0x1f)),
             local_574 == 0)))))) &&
          (((*in_R8 >> 0x18 & 3) == 2 ||
           (local_574 = String::_opChar(in_stack_fffffffffffff9b8,in_stack_fffffffffffff9b4,c),
           local_574 == 0)))) &&
         (((*in_R8 >> 0x18 & 3) != 1 ||
          (local_574 = String::_opChar(in_stack_fffffffffffff9b8,in_stack_fffffffffffff9b4,c),
          local_574 == 0)))) {
        local_574 = 0;
      }
    }
  }
  else if ((*in_R8 & 7) == 4) {
    uVar4 = *(ulong *)(in_R8 + 2);
    uVar3 = *in_R8 >> 0x14 & 0xf;
    if (uVar3 != 0) {
      in_stack_fffffffffffff9d8 = formatShiftOp(in_stack_fffffffffffff9b8,in_stack_fffffffffffff9b4)
      ;
      if (in_stack_fffffffffffff9d8 != 0) {
        return in_stack_fffffffffffff9d8;
      }
      EVar2 = String::_opChar(in_stack_fffffffffffff9b8,in_stack_fffffffffffff9b4,c);
      if (EVar2 != 0) {
        return EVar2;
      }
      in_stack_fffffffffffff9d4 = kAssign;
    }
    bVar1 = Support::test<asmjit::v1_14::FormatFlags,asmjit::v1_14::FormatFlags>(in_ESI,kHexImms);
    if ((bVar1) && (9 < uVar4)) {
      MVar6 = kAssign;
      i_00 = 0xffffffffffffffff;
      local_574 = String::_opString((String *)CONCAT44(uVar3,in_stack_fffffffffffff9d8),
                                    in_stack_fffffffffffff9d4,in_stack_fffffffffffff9c8,
                                    in_stack_fffffffffffff9c0);
      if (local_574 == 0) {
        local_574 = String::_opNumber(in_RDI,MVar6,i_00,base_00,in_stack_fffffffffffffa98,flags_00);
      }
    }
    else {
      local_2e4 = 10;
      local_2f0 = 0;
      local_2f4 = 0;
      local_24 = 0;
      local_28 = 0x80000000;
      local_2e0 = uVar4;
      local_574 = String::_opNumber(in_stack_fffffffffffffab8,MVar6,in_stack_fffffffffffffaa8,
                                    base_00,in_stack_fffffffffffffa98,flags_00);
    }
  }
  else if ((*in_R8 & 7) == 5) {
    local_574 = Formatter::formatLabel
                          ((String *)CONCAT44(in_stack_fffffffffffffa3c,in_stack_fffffffffffffa38),
                           in_stack_fffffffffffffa34,
                           (BaseEmitter *)
                           CONCAT44(in_stack_fffffffffffffa2c,in_stack_fffffffffffffa28),
                           in_stack_fffffffffffffa24);
  }
  else if ((*in_R8 & 7) == 3) {
    local_574 = formatRegisterList((String *)
                                   CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8),
                                   in_stack_fffffffffffff9f4,in_stack_fffffffffffff9e8,
                                   (Arch)((ulong)in_stack_fffffffffffff9e0 >> 0x38),
                                   (RegType)((ulong)in_stack_fffffffffffff9e0 >> 0x30),
                                   (uint32_t)in_stack_fffffffffffff9e0);
  }
  else {
    local_574 = String::_opString((String *)
                                  CONCAT44(in_stack_fffffffffffff9dc,in_stack_fffffffffffff9d8),
                                  in_stack_fffffffffffff9d4,in_stack_fffffffffffff9c8,
                                  in_stack_fffffffffffff9c0);
  }
  return local_574;
}

Assistant:

ASMJIT_FAVOR_SIZE Error FormatterInternal::formatOperand(
  String& sb,
  FormatFlags flags,
  const BaseEmitter* emitter,
  Arch arch,
  const Operand_& op) noexcept {

  if (op.isReg()) {
    const BaseReg& reg = op.as<BaseReg>();

    uint32_t elementType = op._signature.getField<BaseVec::kSignatureRegElementTypeMask>();
    uint32_t elementIndex = op.as<BaseVec>().elementIndex();

    if (!op.as<BaseVec>().hasElementIndex())
      elementIndex = 0xFFFFFFFFu;

    return formatRegister(sb, flags, emitter, arch, reg.type(), reg.id(), elementType, elementIndex);
  }

  if (op.isMem()) {
    const Mem& m = op.as<Mem>();
    ASMJIT_PROPAGATE(sb.append('['));

    if (m.hasBase()) {
      if (m.hasBaseLabel()) {
        ASMJIT_PROPAGATE(Formatter::formatLabel(sb, flags, emitter, m.baseId()));
      }
      else {
        FormatFlags modifiedFlags = flags;
        if (m.isRegHome()) {
          ASMJIT_PROPAGATE(sb.append('&'));
          modifiedFlags &= ~FormatFlags::kRegCasts;
        }
        ASMJIT_PROPAGATE(formatRegister(sb, modifiedFlags, emitter, arch, m.baseType(), m.baseId()));
      }
    }
    else {
      // ARM really requires base.
      if (m.hasIndex() || m.hasOffset()) {
        ASMJIT_PROPAGATE(sb.append("<None>"));
      }
    }

    // The post index makes it look like there was another operand, but it's
    // still the part of AsmJit's `arm::Mem` operand so it's consistent with
    // other architectures.
    if (m.isPostIndex())
      ASMJIT_PROPAGATE(sb.append(']'));

    if (m.hasIndex()) {
      ASMJIT_PROPAGATE(sb.append(", "));
      ASMJIT_PROPAGATE(formatRegister(sb, flags, emitter, arch, m.indexType(), m.indexId()));
    }

    if (m.hasOffset()) {
      ASMJIT_PROPAGATE(sb.append(", "));

      int64_t off = int64_t(m.offset());
      uint32_t base = 10;

      if (Support::test(flags, FormatFlags::kHexOffsets) && uint64_t(off) > 9)
        base = 16;

      if (base == 10) {
        ASMJIT_PROPAGATE(sb.appendInt(off, base));
      }
      else {
        ASMJIT_PROPAGATE(sb.append("0x"));
        ASMJIT_PROPAGATE(sb.appendUInt(uint64_t(off), base));
      }
    }

    if (m.hasShift()) {
      ASMJIT_PROPAGATE(sb.append(' '));
      if (!m.isPreOrPost())
        ASMJIT_PROPAGATE(formatShiftOp(sb, m.shiftOp()));
      ASMJIT_PROPAGATE(sb.appendFormat(" %u", m.shift()));
    }

    if (!m.isPostIndex())
      ASMJIT_PROPAGATE(sb.append(']'));

    if (m.isPreIndex())
      ASMJIT_PROPAGATE(sb.append('!'));

    return kErrorOk;
  }

  if (op.isImm()) {
    const Imm& i = op.as<Imm>();
    int64_t val = i.value();
    uint32_t predicate = i.predicate();

    if (predicate) {
      ASMJIT_PROPAGATE(formatShiftOp(sb, ShiftOp(predicate)));
      ASMJIT_PROPAGATE(sb.append(' '));
    }

    if (Support::test(flags, FormatFlags::kHexImms) && uint64_t(val) > 9) {
      ASMJIT_PROPAGATE(sb.append("0x"));
      return sb.appendUInt(uint64_t(val), 16);
    }
    else {
      return sb.appendInt(val, 10);
    }
  }

  if (op.isLabel()) {
    return Formatter::formatLabel(sb, flags, emitter, op.id());
  }

  if (op.isRegList()) {
    const BaseRegList& regList = op.as<BaseRegList>();
    return formatRegisterList(sb, flags, emitter, arch, regList.type(), regList.list());
  }

  return sb.append("<None>");
}